

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.hpp
# Opt level: O2

double __thiscall tfs::TMatrix<double>::max(TMatrix<double> *this)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  double dVar4;
  
  bVar2 = isEmpty(this);
  if (bVar2) {
    report_problem("Error",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                   ,"max",0x177,"empty matrix");
    dVar4 = 0.0;
  }
  else {
    pdVar3 = this->m_data;
    dVar1 = *pdVar3;
    while (dVar4 = dVar1, pdVar3 = pdVar3 + 1, pdVar3 < this->m_end) {
      dVar1 = *pdVar3;
      if (*pdVar3 <= dVar4) {
        dVar1 = dVar4;
      }
    }
  }
  return dVar4;
}

Assistant:

inline T max( void ) const {                // Return maximum value.
            if( isEmpty()) {
                log_error( "empty matrix" );
                return 0;
            }
            const T *      data = m_data;
            const T * const end = m_end;
            
            T result = *data++;
            while( data < end ) {
                if( *data > result ) {
                    result = *data;
                }
                data++;
            }
            return result;
        }